

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::BaseRockSample::InitialParticleSet
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          BaseRockSample *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  State *local_30;
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = (byte)this->num_rocks_;
  iVar4 = (int)((ulong)*(undefined8 *)&this->start_pos_ >> 0x20) * (this->grid_).xsize_ +
          (int)*(undefined8 *)&this->start_pos_ << (bVar1 & 0x1f);
  if (this->num_rocks_ != 0x1f) {
    iVar2 = 1 << (bVar1 & 0x1f);
    iVar3 = iVar2;
    if (iVar2 < 2) {
      iVar3 = 1;
    }
    do {
      local_30 = (State *)(**(code **)(*(long *)this + 0xb8))
                                    (SUB84(1.0 / (double)iVar2,0),this,iVar4);
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
                 &local_30);
      iVar4 = iVar4 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> BaseRockSample::InitialParticleSet() const {
	vector<State*> particles;
	int N = 1 << num_rocks_, pos = CoordToIndex(start_pos_) * (1 << num_rocks_);
	for (int n = 0; n < N; n++) {
		RockSampleState* rockstate = static_cast<RockSampleState*>(Allocate(
			n + pos, 1.0 / N));
		particles.push_back(rockstate);
	}
	return particles;
}